

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecWrd.h
# Opt level: O3

Vec_Wrd_t * Vec_WrdUniqifyHash(Vec_Wrd_t *vData,int nWordSize)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  void *__s;
  void *__s_00;
  void *__ptr;
  Vec_Wrd_t *p;
  word *pwVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  word *pwVar9;
  int c;
  long lVar10;
  uint *puVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  size_t __size;
  
  uVar3 = vData->nSize;
  uVar8 = (ulong)(int)uVar3;
  vData->nCap = vData->nCap << 1;
  iVar14 = 0x1f;
  if (uVar3 - 1 != 0) {
    for (; uVar3 - 1 >> iVar14 == 0; iVar14 = iVar14 + -1) {
    }
  }
  uVar12 = (uint)(byte)(0x20 - ((byte)iVar14 ^ 0x1f));
  if (uVar8 < 2) {
    uVar12 = uVar3;
  }
  iVar14 = 1 << ((byte)uVar12 & 0x1f);
  vData->nSize = uVar3 * 2;
  __size = (long)iVar14 << 2;
  __s = malloc(__size);
  memset(__s,0xff,__size);
  __s_00 = malloc(__size);
  memset(__s_00,0xff,__size);
  __ptr = malloc(uVar8 * 4);
  if ((long)uVar8 < 1) {
    iVar6 = 0;
  }
  else {
    pwVar4 = vData->pArray;
    uVar5 = 0;
    iVar6 = 0;
    pwVar9 = pwVar4;
    do {
      lVar10 = 0;
      uVar12 = 0;
      do {
        uVar12 = *(int *)(Vec_IntUniqueHashKey_s_BigPrimes +
                         (ulong)(*(byte *)((long)pwVar9 + lVar10) >> 4) * 4) *
                 (&DAT_00a4d514)[lVar10 * 2] +
                 *(int *)(Vec_IntUniqueHashKey_s_BigPrimes +
                         (ulong)(*(byte *)((long)pwVar9 + lVar10) & 0xf) * 4) *
                 (&Vec_IntUniqueHashKey_s_BigPrimes2)[lVar10 * 2] + uVar12;
        lVar10 = lVar10 + 1;
      } while (lVar10 != 8);
      lVar10 = (long)(int)(uVar12 & iVar14 - 1U);
      uVar12 = *(uint *)((long)__s + lVar10 * 4);
      if (uVar12 == 0xffffffff) {
        puVar11 = (uint *)((long)__s + lVar10 * 4);
      }
      else {
        do {
          if (((int)uVar12 < 0) || (uVar3 * 2 <= uVar12 * 2)) goto LAB_007793e7;
          if (pwVar4[uVar5] == *(word *)((long)pwVar4 + (ulong)(uVar12 * 2) * 4)) goto LAB_007792a5;
          uVar13 = (ulong)uVar12;
          uVar12 = *(uint *)((long)__s_00 + uVar13 * 4);
        } while (uVar12 != 0xffffffff);
        puVar11 = (uint *)((long)__s_00 + uVar13 * 4);
      }
      uVar12 = (uint)uVar5;
      *puVar11 = uVar12;
      iVar6 = iVar6 + 1;
LAB_007792a5:
      *(uint *)((long)__ptr + uVar5 * 4) = uVar12;
      uVar5 = uVar5 + 1;
      pwVar9 = pwVar9 + 1;
    } while (uVar5 != uVar8);
    iVar6 = iVar6 * 2;
  }
  if (__s != (void *)0x0) {
    free(__s);
  }
  if (__s_00 != (void *)0x0) {
    free(__s_00);
  }
  p = (Vec_Wrd_t *)malloc(0x10);
  iVar14 = 0x10;
  if (0xe < iVar6 - 1U) {
    iVar14 = iVar6;
  }
  p->nSize = 0;
  p->nCap = iVar14;
  iVar7 = 0;
  if (iVar14 == 0) {
    pwVar4 = (word *)0x0;
  }
  else {
    pwVar4 = (word *)malloc((long)iVar14 << 2);
  }
  p->pArray = pwVar4;
  if (0 < (int)uVar3) {
    uVar5 = 0;
    do {
      uVar3 = *(uint *)((long)__ptr + uVar5 * 4);
      if ((long)uVar5 <= (long)(int)uVar3) {
        if (uVar5 != uVar3) {
          __assert_fail("Ent == i",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x65e,"Vec_Int_t *Vec_IntUniqifyHash(Vec_Int_t *, int)");
        }
        if ((long)vData->nSize <= (long)(uVar5 * 2)) {
LAB_007793e7:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
        }
        pwVar4 = vData->pArray;
        Vec_IntPush((Vec_Int_t *)p,(int)pwVar4[uVar5]);
        Vec_IntPush((Vec_Int_t *)p,*(int *)((long)pwVar4 + uVar5 * 8 + 4));
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != uVar8);
    iVar7 = p->nSize;
  }
  if (iVar7 == iVar6) {
    if (__ptr != (void *)0x0) {
      free(__ptr);
    }
    uVar1 = vData->nCap;
    uVar2 = vData->nSize;
    vData->nCap = (int)uVar1 / 2;
    vData->nSize = (int)uVar2 / 2;
    p->nSize = iVar6 >> 1;
    p->nCap = p->nCap / 2;
    return p;
  }
  __assert_fail("Vec_IntSize(vUnique) == nUnique * nIntSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x661,"Vec_Int_t *Vec_IntUniqifyHash(Vec_Int_t *, int)");
}

Assistant:

static inline Vec_Wrd_t * Vec_WrdUniqifyHash( Vec_Wrd_t * vData, int nWordSize )
{
    Vec_Int_t * vResInt;
    Vec_Int_t * vDataInt = (Vec_Int_t *)vData;
    vDataInt->nSize *= 2;
    vDataInt->nCap *= 2;
    vResInt = Vec_IntUniqifyHash( vDataInt, 2 * nWordSize );
    vDataInt->nSize /= 2;
    vDataInt->nCap /= 2;
    vResInt->nSize /= 2;
    vResInt->nCap /= 2;
    return (Vec_Wrd_t *)vResInt;
}